

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_LookupNetwork_Test::TestBody
          (PersistentStorageJsonTestSuite_LookupNetwork_Test *this)

{
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  char *in_R9;
  string local_6f0;
  AssertHelper local_6d0;
  Message local_6c8;
  bool local_6b9;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_640;
  Message local_638;
  bool local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar__9;
  Network net;
  AssertHelper local_598;
  Message local_590;
  bool local_581;
  undefined1 local_580 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_550;
  Message local_548;
  Network local_540;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__7;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  retLookup;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_448;
  Message local_440;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  DomainId local_3e8;
  NetworkId local_3e4;
  Network local_3e0;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_300;
  Message local_2f8;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  DomainId local_2a0;
  NetworkId local_29c;
  Network local_298;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1b8;
  Message local_1b0;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  DomainId local_158;
  NetworkId local_154;
  Network local_150;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_d0 [4];
  NetworkId newId;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  PersistentStorageJson psj;
  PersistentStorageJsonTestSuite_LookupNetwork_Test *this_local;
  
  psj.mStorageLock.mPlatform = (sem_t *)this;
  unlink("./tmp/test.tmp");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"./tmp/test.tmp",&local_71);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            ((PersistentStorageJson *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open
                    ((PersistentStorageJson *)local_50);
  local_99 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_98,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x28d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ot::commissioner::persistent_storage::NetworkId::NetworkId
            ((NetworkId *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_154,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_158,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"nwk1",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"2000:aaa1::0/8",&local_1a1);
  pcVar3 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&local_150,&local_154,&local_158,&local_178,0xfffffffffffffff1,0xb,0xfff1,&local_1a0,1)
  ;
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_150,
                     (NetworkId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_e9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  ot::commissioner::persistent_storage::Network::~Network(&local_150);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_e8,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk1\", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, \"2000:aaa1::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x292,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_1e9 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1e8,
               (AssertionResult *)"newId.mId == 0","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x293,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_29c,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_2a0,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"nwk2",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"2000:aaa2::0/8",&local_2e9);
  pcVar3 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&local_298,&local_29c,&local_2a0,&local_2c0,0xfffffffffffffff2,0xb,0xfff2,&local_2e8,1)
  ;
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_298,
                     (NetworkId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_231 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  ot::commissioner::persistent_storage::Network::~Network(&local_298);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_230,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk2\", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, \"2000:aaa2::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x295,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_331 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_330,&local_331,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar2) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_330,
               (AssertionResult *)"newId.mId == 1","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x296,pcVar3);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_3e4,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_3e8,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"nwk3",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"2000:aaa3::0/8",&local_431);
  pcVar3 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&local_3e0,&local_3e4,&local_3e8,&local_408,0xfffffffffffffff3,0xb,0xfff3,&local_430,1)
  ;
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    ((PersistentStorageJson *)local_50,&local_3e0,
                     (NetworkId *)
                     ((long)&gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4));
  local_379 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  ot::commissioner::persistent_storage::Network::~Network(&local_3e0);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar2) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_378,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk3\", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, \"2000:aaa3::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x298,pcVar4);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_479 = gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &retLookup.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_478,
               (AssertionResult *)"newId.mId == 2","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x299,pcVar4);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string
              ((string *)
               &retLookup.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::Network::Network(&local_540);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
                    ((PersistentStorageJson *)local_50,&local_540,
                     (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)&gtest_ar__7.message_);
  local_4d9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  ot::commissioner::persistent_storage::Network::~Network(&local_540);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_4d8,
               (AssertionResult *)
               "psj.Lookup(Network{}, retLookup) == PersistentStorage::Status::kSuccess","false",
               "true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x29e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  sVar5 = std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  *)&gtest_ar__7.message_);
  local_581 = sVar5 == 3;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_580,&local_581,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar2) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net.mCcm,(internal *)local_580,(AssertionResult *)"retLookup.size() == 3",
               "false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x29f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&net.mCcm);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::clear((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar__9.message_);
  std::__cxx11::string::operator=((string *)&net,"nwk1");
  net.mMlp.field_2._8_4_ = 1;
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
                    ((PersistentStorageJson *)local_50,(Network *)&gtest_ar__9.message_,
                     (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)&gtest_ar__7.message_);
  local_629 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_628,&local_629,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar2) {
    testing::Message::Message(&local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_628,
               (AssertionResult *)
               "psj.Lookup(net, retLookup) == PersistentStorage::Status::kSuccess","false","true",
               pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  sVar5 = std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  *)&gtest_ar__7.message_);
  local_671 = sVar5 == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(&local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_670,
               (AssertionResult *)"retLookup.size() == 1","false","true",pcVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close
                    ((PersistentStorageJson *)local_50);
  local_6b9 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b8,&local_6b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar2) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6f0,(internal *)local_6b8,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar__9.message_);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
            ((PersistentStorageJson *)local_50);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, LookupNetwork)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Populate storage with initial data
    NetworkId newId;
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk2", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, "2000:aaa2::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk3", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, "2000:aaa3::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    // The test
    std::vector<Network> retLookup;

    EXPECT_TRUE(psj.Lookup(Network{}, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 3);

    retLookup.clear();

    Network net;
    net.mName = "nwk1";
    net.mCcm  = true;
    EXPECT_TRUE(psj.Lookup(net, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}